

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

void __thiscall fasttext::FastText::saveVectors(FastText *this)

{
  _Base_ptr *pp_Var1;
  element_type *peVar2;
  pointer pcVar3;
  long lVar4;
  undefined8 uVar5;
  char cVar6;
  int32_t iVar7;
  ostream *poVar8;
  long *plVar9;
  int id;
  int local_ad4;
  Vector subipa;
  Vector submorph;
  Vector sublemma;
  Vector subvec;
  Vector vec;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mapOfSubWords;
  string word;
  ofstream ofi;
  filebuf local_a28 [8];
  undefined1 local_a20 [232];
  ios_base aiStack_938 [264];
  ofstream ofmorph;
  filebuf local_828 [8];
  undefined1 local_820 [232];
  ios_base aiStack_738 [264];
  ofstream oflemma;
  filebuf local_628 [8];
  undefined1 local_620 [232];
  ios_base aiStack_538 [264];
  ofstream ofsub;
  filebuf local_428 [8];
  undefined1 local_420 [232];
  ios_base aiStack_338 [264];
  ofstream ofs;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Saving Vectors",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar3 = (peVar2->output)._M_dataplus._M_p;
  _ofsub = local_420;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ofsub,pcVar3,pcVar3 + (peVar2->output)._M_string_length);
  std::__cxx11::string::append((char *)&ofsub);
  std::ofstream::ofstream(&ofs,(string *)&ofsub,_S_out);
  if (_ofsub != local_420) {
    operator_delete(_ofsub);
  }
  peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar3 = (peVar2->suboutput)._M_dataplus._M_p;
  _oflemma = local_620;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&oflemma,pcVar3,pcVar3 + (peVar2->suboutput)._M_string_length);
  std::__cxx11::string::append((char *)&oflemma);
  std::ofstream::ofstream(&ofsub,(string *)&oflemma,_S_out);
  if (_oflemma != local_620) {
    operator_delete(_oflemma);
  }
  peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar3 = (peVar2->lemmaoutput)._M_dataplus._M_p;
  _ofmorph = local_820;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ofmorph,pcVar3,pcVar3 + (peVar2->lemmaoutput)._M_string_length);
  std::__cxx11::string::append((char *)&ofmorph);
  std::ofstream::ofstream(&oflemma,(string *)&ofmorph,_S_out);
  if (_ofmorph != local_820) {
    operator_delete(_ofmorph);
  }
  peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar3 = (peVar2->morphoutput)._M_dataplus._M_p;
  _ofi = local_a20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ofi,pcVar3,pcVar3 + (peVar2->morphoutput)._M_string_length);
  std::__cxx11::string::append((char *)&ofi);
  std::ofstream::ofstream(&ofmorph,(string *)&ofi,_S_out);
  if (_ofi != local_a20) {
    operator_delete(_ofi);
  }
  peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pp_Var1 = &mapOfSubWords._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  pcVar3 = (peVar2->ipaoutput)._M_dataplus._M_p;
  mapOfSubWords._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&mapOfSubWords,pcVar3,pcVar3 + (peVar2->ipaoutput)._M_string_length);
  std::__cxx11::string::append((char *)&mapOfSubWords);
  std::ofstream::ofstream(&ofi,(string *)&mapOfSubWords,_S_out);
  if ((_Base_ptr *)mapOfSubWords._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)mapOfSubWords._M_t._M_impl._0_8_);
  }
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error opening file for saving vectors.",0x26);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    cVar6 = std::__basic_file<char>::is_open();
    if (cVar6 != '\0') {
      iVar7 = Dictionary::nwords((this->dict_).
                                 super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&ofs,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      plVar9 = (long *)std::ostream::operator<<
                                 ((ostream *)poVar8,
                                  ((this->args_).
                                   super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->dim);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      Vector::Vector(&vec,(long)((this->args_).
                                 super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->dim);
      Vector::Vector(&subvec,(long)((this->args_).
                                    super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->dim);
      Vector::Vector(&sublemma,
                     (long)((this->args_).
                            super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           dim);
      Vector::Vector(&submorph,
                     (long)((this->args_).
                            super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           dim);
      Vector::Vector(&subipa,(long)((this->args_).
                                    super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->dim);
      mapOfSubWords._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &mapOfSubWords._M_t._M_impl.super__Rb_tree_header._M_header;
      mapOfSubWords._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      id = 0;
      mapOfSubWords._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      mapOfSubWords._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      mapOfSubWords._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           mapOfSubWords._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        local_ad4 = id;
        iVar7 = Dictionary::nwords((this->dict_).
                                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
        if (iVar7 <= id) break;
        Dictionary::getWord_abi_cxx11_
                  (&word,(this->dict_).
                         super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ,id);
        getVector(this,&vec,&word);
        getSubVector(this,&subvec,&sublemma,&submorph,&subipa,&mapOfSubWords,&local_ad4,&ofsub,
                     &oflemma,&ofmorph,&ofi);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&ofs,word._M_dataplus._M_p,word._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        poVar8 = operator<<(poVar8,&vec);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)word._M_dataplus._M_p != &word.field_2) {
          operator_delete(word._M_dataplus._M_p);
        }
        id = id + 1;
      }
      std::ofstream::close();
      std::
      _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&mapOfSubWords._M_t);
      Vector::~Vector(&subipa);
      Vector::~Vector(&submorph);
      Vector::~Vector(&sublemma);
      Vector::~Vector(&subvec);
      Vector::~Vector(&vec);
      uVar5 = _memcpy;
      lVar4 = _VTT;
      _ofi = (undefined1 *)_VTT;
      *(undefined8 *)(&ofi + *(long *)(_VTT + -0x18)) = _memcpy;
      std::filebuf::~filebuf(local_a28);
      std::ios_base::~ios_base(aiStack_938);
      _ofmorph = (undefined1 *)lVar4;
      *(undefined8 *)(&ofmorph + *(long *)(lVar4 + -0x18)) = uVar5;
      std::filebuf::~filebuf(local_828);
      std::ios_base::~ios_base(aiStack_738);
      _oflemma = (undefined1 *)lVar4;
      *(undefined8 *)(&oflemma + *(long *)(lVar4 + -0x18)) = uVar5;
      std::filebuf::~filebuf(local_628);
      std::ios_base::~ios_base(aiStack_538);
      _ofsub = (undefined1 *)lVar4;
      *(undefined8 *)(&ofsub + *(long *)(lVar4 + -0x18)) = uVar5;
      std::filebuf::~filebuf(local_428);
      std::ios_base::~ios_base(aiStack_338);
      _ofs = lVar4;
      *(undefined8 *)(&ofs + *(long *)(lVar4 + -0x18)) = uVar5;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(aiStack_138);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error opening file for saving subword vectors.",0x2e);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  exit(1);
}

Assistant:

void FastText::saveVectors() {
  std::cout << "Saving Vectors" << std::endl;
  std::ofstream ofs(args_->output + ".vec");
  std::ofstream ofsub(args_->suboutput + ".vec");
  std::ofstream oflemma(args_->lemmaoutput + ".vec");
  std::ofstream ofmorph(args_->morphoutput + ".vec");
  std::ofstream ofi(args_->ipaoutput + ".vec");
  if (!ofs.is_open()) {
    std::cout << "Error opening file for saving vectors." << std::endl;
    exit(EXIT_FAILURE);
  }
  if (!ofsub.is_open()) {
    std::cout << "Error opening file for saving subword vectors." << std::endl;
    exit(EXIT_FAILURE);
  }
  ofs << dict_->nwords() << " " << args_->dim << std::endl;
  Vector vec(args_->dim);
  Vector subvec(args_->dim);
  Vector sublemma(args_->dim);
  Vector submorph(args_->dim);
  Vector subipa(args_->dim);
  std::map<int32_t,std::string> mapOfSubWords;
 
  for (int32_t i = 0; i < dict_->nwords(); i++) {
    std::string word = dict_->getWord(i);
   //std::cout << i << std::endl; 
   getVector(vec, word);
   getSubVector(subvec,sublemma,submorph,subipa, mapOfSubWords,i,ofsub,oflemma,ofmorph,ofi);
    ofs << word << " " << vec << std::endl;
  }
  ofs.close();
}